

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncMin(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
          vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong local_58;
  size_t i;
  int64_t iStack_48;
  bool isInt;
  int64_t intCur;
  int64_t intMin;
  double floatCur;
  double floatMin;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  ExpressionValue *result;
  
  ExpressionValue::ExpressionValue(__return_storage_ptr__);
  floatCur = std::numeric_limits<double>::max();
  iStack_48 = std::numeric_limits<long>::max();
  bVar1 = true;
  local_58 = 0;
  intCur = iStack_48;
  do {
    sVar2 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::size(parameters);
    if (sVar2 <= local_58) {
      if (bVar1) {
        (__return_storage_ptr__->field_1).intValue = intCur;
        __return_storage_ptr__->type = Integer;
      }
      else {
        (__return_storage_ptr__->field_1).floatValue = floatCur;
        __return_storage_ptr__->type = Float;
      }
      return __return_storage_ptr__;
    }
    pvVar3 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                       (parameters,local_58);
    if (pvVar3->type == Integer) {
      pvVar3 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                         (parameters,local_58);
      iStack_48 = (pvVar3->field_1).intValue;
      pvVar3 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                         (parameters,local_58);
      intMin = (int64_t)(double)(pvVar3->field_1).intValue;
    }
    else {
      if (pvVar3->type != Float) {
        return __return_storage_ptr__;
      }
      pvVar3 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                         (parameters,local_58);
      intMin = (pvVar3->field_1).intValue;
      bVar1 = false;
    }
    if (iStack_48 < intCur) {
      intCur = iStack_48;
    }
    if ((double)intMin < floatCur) {
      floatCur = (double)intMin;
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

ExpressionValue expFuncMin(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;
	double floatMin, floatCur;
	int64_t intMin, intCur;

	floatCur = floatMin = std::numeric_limits<double>::max();
	intCur = intMin = std::numeric_limits<int64_t>::max();
	bool isInt = true;

	for (size_t i = 0; i < parameters.size(); i++)
	{
		switch (parameters[i].type)
		{
		case ExpressionValueType::Integer:
			intCur = parameters[i].intValue;
			floatCur = (double)parameters[i].intValue;
			break;
		case ExpressionValueType::Float:
			floatCur = parameters[i].floatValue;
			isInt = false;
			break;
		default:
			return result;
		}

		if (intCur < intMin)
			intMin = intCur;
		if (floatCur < floatMin)
			floatMin = floatCur;
	}

	if (isInt)
	{
		result.intValue = intMin;
		result.type = ExpressionValueType::Integer;
	}
	else
	{
		result.floatValue = floatMin;
		result.type = ExpressionValueType::Float;
	}

	return result;
}